

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_c13565::MemPoolAccept::AcceptSubPackage
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *subpackage,ATMPArgs *args)

{
  char *pcVar1;
  long lVar2;
  CTransactionRef *ptx;
  element_type *peVar3;
  PackageValidationState state;
  __node_base _Var4;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  undefined1 in_stack_fffffffffffffcd8 [16];
  CChainParams *pCVar5;
  int64_t iVar6;
  bool bVar7;
  undefined7 in_stack_fffffffffffffcf9;
  vector<COutPoint,_std::allocator<COutPoint>_> *pvVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined3 in_stack_fffffffffffffd0d;
  _Storage<CFeeRate,_true> _Var11;
  undefined8 uVar12;
  undefined1 local_2d8 [24];
  undefined1 auStack_2c0 [8];
  __node_base _Stack_2b8;
  _Base_ptr local_2b0;
  _Alloc_hider local_2a8;
  _Base_ptr local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_278 [10];
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_1d0;
  ValidationState<PackageValidationResult> local_1a0;
  PackageValidationState package_state_wrapped;
  MempoolAcceptResult single_res;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ptx = (subpackage->
        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(subpackage->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ptx) < 0x11) {
    pCVar5 = args->m_chainparams;
    iVar6 = args->m_accept_time;
    pvVar8 = args->m_coins_to_uncache;
    bVar9 = args->m_test_accept;
    _Var11 = (args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
             super__Optional_payload_base<CFeeRate>._M_payload;
    uVar12._0_1_ = (args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload
                   .super__Optional_payload_base<CFeeRate>._M_engaged;
    uVar12._1_7_ = *(undefined7 *)
                    &(args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>.
                     _M_payload.super__Optional_payload_base<CFeeRate>.field_0x9;
    bVar7 = false;
    uVar10._0_1_ = true;
    uVar10._1_1_ = true;
    uVar10._2_1_ = true;
    uVar10._3_1_ = false;
    AcceptSingleTransaction(&single_res,this,ptx,(ATMPArgs *)&stack0xfffffffffffffce8);
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus
    ._M_p = (pointer)&package_state_wrapped.super_ValidationState<PackageValidationResult>.
                      m_reject_reason.field_2;
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_result =
         PCKG_RESULT_UNSET;
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_reject_reason.
    _M_string_length = 0;
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_local_buf[0] = '\0';
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus
    ._M_p = (pointer)&package_state_wrapped.super_ValidationState<PackageValidationResult>.
                      m_debug_message.field_2;
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_debug_message.
    _M_string_length = 0;
    package_state_wrapped.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_local_buf[0] = '\0';
    if (single_res.m_result_type != VALID) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2d8,"transaction failed",(allocator<char> *)&local_1d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"",(allocator<char> *)&stack0xfffffffffffffce7);
      ValidationState<PackageValidationResult>::Invalid
                (&package_state_wrapped.super_ValidationState<PackageValidationResult>,PCKG_TX,
                 (string *)local_2d8,(string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)local_2d8);
    }
    ValidationState<PackageValidationResult>::ValidationState
              (&local_1a0,&package_state_wrapped.super_ValidationState<PackageValidationResult>);
    peVar3 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2d8._0_8_ =
         *(undefined8 *)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_2d8._8_8_ =
         *(undefined8 *)
          ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_2d8._16_8_ =
         *(undefined8 *)
          ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    auStack_2c0 = *(undefined1 (*) [8])
                   ((long)(peVar3->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                   0x18);
    MempoolAcceptResult::MempoolAcceptResult((MempoolAcceptResult *)&_Stack_2b8,&single_res);
    __l._M_len = 1;
    __l._M_array = (iterator)local_2d8;
    std::
    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
           *)&local_1d0,__l,(less<uint256> *)&stack0xfffffffffffffce7,
          (allocator_type *)&stack0xfffffffffffffce6);
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)pCVar5;
    state.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffffcd8._0_4_;
    state.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffffcd8._4_4_;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)in_stack_fffffffffffffcd8._8_8_;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = iVar6;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf[8] =
         bVar7;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._9_7_ =
         in_stack_fffffffffffffcf9;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)pvVar8;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._0_1_ =
         bVar9;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._1_1_ =
         SUB41(uVar10,0);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._2_1_ =
         SUB41(uVar10,1);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._3_1_ =
         SUB41(uVar10,2);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._4_1_ =
         SUB41(uVar10,3);
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length._5_3_ =
         in_stack_fffffffffffffd0d;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)_Var11;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = uVar12;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)&local_1a0);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree(&local_1d0);
    MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&_Stack_2b8);
    ValidationState<PackageValidationResult>::~ValidationState(&local_1a0);
    ValidationState<PackageValidationResult>::~ValidationState
              (&package_state_wrapped.super_ValidationState<PackageValidationResult>);
    MempoolAcceptResult::~MempoolAcceptResult(&single_res);
  }
  else {
    AcceptMultipleTransactions(__return_storage_ptr__,this,subpackage,args);
  }
  local_2a8._M_p = (pointer)&_Stack_2b8;
  local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffffffffff00;
  local_2d8._0_8_ = (pointer)0x0;
  local_2d8._8_8_ = 0;
  local_2b0 = (_Base_ptr)0x0;
  auStack_2c0 = (undefined1  [8])0x0;
  _Stack_2b8._M_nxt = (_Hash_node_base *)0x0;
  pcVar1 = local_298._M_local_buf + 8;
  local_298._M_allocated_capacity = 0;
  aaStack_278[0]._8_8_ = 0;
  local_280 = 0;
  aaStack_278[0]._M_allocated_capacity = 0;
  (this->m_subpackage).m_rbf = false;
  (this->m_subpackage).m_total_modified_fees = 0;
  (this->m_subpackage).m_total_vsize = 0;
  local_2a0 = (_Base_ptr)local_2a8._M_p;
  local_298._8_8_ = pcVar1;
  local_288._M_p = pcVar1;
  std::_Rb_tree<$270907ca$>::operator=
            (&(this->m_subpackage).m_all_conflicts._M_t,(_Rb_tree<_270907ca_> *)auStack_2c0);
  std::__cxx11::
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>::
  _M_move_assign(&(this->m_subpackage).m_replaced_transactions,pcVar1);
  (this->m_subpackage).m_conflicting_fees = aaStack_278[0]._M_allocated_capacity;
  (this->m_subpackage).m_conflicting_size = aaStack_278[0]._8_8_;
  SubPackageState::~SubPackageState((SubPackageState *)local_2d8);
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable((_Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_2d8,&(this->m_viewmempool).m_non_base_coins._M_h);
  for (_Var4._M_nxt = _Stack_2b8._M_nxt; _Var4._M_nxt != (_Hash_node_base *)0x0;
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
    CCoinsViewCache::Uncache(&this->m_view,(COutPoint *)(_Var4._M_nxt + 1));
  }
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_2d8);
  CCoinsViewMemPool::Reset(&this->m_viewmempool);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptSubPackage(const std::vector<CTransactionRef>& subpackage, ATMPArgs& args)
{
    AssertLockHeld(::cs_main);
    AssertLockHeld(m_pool.cs);
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_pool.cs) {
        if (subpackage.size() > 1) {
            return AcceptMultipleTransactions(subpackage, args);
        }
        const auto& tx = subpackage.front();
        ATMPArgs single_args = ATMPArgs::SingleInPackageAccept(args);
        const auto single_res = AcceptSingleTransaction(tx, single_args);
        PackageValidationState package_state_wrapped;
        if (single_res.m_result_type != MempoolAcceptResult::ResultType::VALID) {
            package_state_wrapped.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        }
        return PackageMempoolAcceptResult(package_state_wrapped, {{tx->GetWitnessHash(), single_res}});
    }